

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim.cpp
# Opt level: O0

bool __thiscall nvim::Nvim::buf_is_loaded(Nvim *this,Buffer buffer)

{
  allocator local_41;
  string local_40;
  bool local_19;
  Buffer BStack_18;
  bool res;
  Buffer buffer_local;
  Nvim *this_local;
  
  BStack_18 = buffer;
  buffer_local = (Buffer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"nvim_buf_is_loaded",&local_41);
  NvimRPC::call<bool,long>(&this->client_,&local_40,&local_19,&stack0xffffffffffffffe8);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  return (bool)(local_19 & 1);
}

Assistant:

bool Nvim::buf_is_loaded(Buffer buffer) {
    bool res;
    client_.call("nvim_buf_is_loaded", res, buffer);
    return res;
}